

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendReceiver.cpp
# Opt level: O1

void __thiscall SendReceiver::printRequestData(SendReceiver *this)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  undefined8 uStack_18;
  
  if ((this->super_JHandler).status == true) {
    uStack_18 = in_RAX;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Full url to file: ",0x12);
    peVar1 = (this->super_JHandler).url_ptr.
             super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(peVar1->str_full)._M_dataplus._M_p,
                        (peVar1->str_full)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nShort url to file: ",0x14);
    peVar1 = (this->super_JHandler).url_ptr.
             super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(peVar1->str_short)._M_dataplus._M_p,
                        (peVar1->str_short)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nFile id: ",10);
    peVar2 = (this->super_JHandler).MD_ptr.
             super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(peVar2->id)._M_dataplus._M_p,(peVar2->id)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nFilename: ",0xb);
    peVar2 = (this->super_JHandler).MD_ptr.
             super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(peVar2->name)._M_dataplus._M_p,(peVar2->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nSize of file: ",0xf);
    peVar2 = (this->super_JHandler).MD_ptr.
             super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(peVar2->size)._M_dataplus._M_p,(peVar2->size)._M_string_length);
    uStack_18 = CONCAT17(10,(undefined7)uStack_18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_18 + 7),1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->super_JHandler).error_msg._M_dataplus._M_p,
                      (this->super_JHandler).error_msg._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void SendReceiver::printRequestData() {
  if (status) {
    std::cout << "Full url to file: " << url_ptr->str_full
              << "\nShort url to file: " << url_ptr->str_short
              << "\nFile id: " << MD_ptr->id
              << "\nFilename: " << MD_ptr->name
              << "\nSize of file: " << MD_ptr->size << '\n';
  } else
    std::cerr << "Error: " << error_msg << std::endl;
}